

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

int __thiscall
vkt::memory::anon_unknown_0::RenderVertexBuffer::verify
          (RenderVertexBuffer *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ReferenceMemory *pRVar1;
  TextureLevel *this_00;
  Vector<float,_4> local_68;
  PixelBufferAccess local_58;
  byte local_2a;
  byte local_29;
  deUint8 y;
  ulong uStack_28;
  deUint8 x;
  size_t pos;
  size_t param_2_local;
  VerifyRenderPassContext *context_local;
  RenderVertexBuffer *this_local;
  
  pos = (size_t)sig;
  param_2_local = (size_t)ctx;
  context_local = (VerifyRenderPassContext *)this;
  for (uStack_28 = 0; uStack_28 < this->m_bufferSize >> 1; uStack_28 = uStack_28 + 1) {
    pRVar1 = (ReferenceMemory *)
             VerifyRenderPassContext::getReference((VerifyRenderPassContext *)param_2_local);
    local_29 = ReferenceMemory::get(pRVar1,uStack_28 << 1);
    pRVar1 = (ReferenceMemory *)
             VerifyRenderPassContext::getReference((VerifyRenderPassContext *)param_2_local);
    local_2a = ReferenceMemory::get(pRVar1,uStack_28 * 2 + 1);
    this_00 = VerifyRenderPassContext::getReferenceTarget((VerifyRenderPassContext *)param_2_local);
    tcu::TextureLevel::getAccess(&local_58,this_00);
    tcu::Vector<float,_4>::Vector(&local_68,1.0,1.0,1.0,1.0);
    tcu::PixelBufferAccess::setPixel(&local_58,&local_68,(uint)local_29,(uint)local_2a,0);
  }
  return (int)uStack_28;
}

Assistant:

void RenderVertexBuffer::verify (VerifyRenderPassContext& context, size_t)
{
	for (size_t pos = 0; pos < (size_t)m_bufferSize / 2; pos++)
	{
		const deUint8 x  = context.getReference().get(pos * 2);
		const deUint8 y  = context.getReference().get((pos * 2) + 1);

		context.getReferenceTarget().getAccess().setPixel(Vec4(1.0f, 1.0f, 1.0f, 1.0f), x, y);
	}
}